

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_encoding.c
# Opt level: O0

int zig_zag_decode_i64(uint8_t *buffer,int64_t *signed_value)

{
  int local_2c;
  ulong uStack_28;
  int bytesRead;
  uint64_t value;
  uint64_t v;
  int64_t *signed_value_local;
  uint8_t *buffer_local;
  
  uStack_28 = (ulong)*buffer & 0x7f;
  local_2c = 1;
  if ((*buffer & 0x80) != 0) {
    local_2c = 2;
    uStack_28 = ((ulong)buffer[1] & 0x7f) << 7 | uStack_28;
    if ((buffer[1] & 0x80) != 0) {
      local_2c = 3;
      uStack_28 = ((ulong)buffer[2] & 0x7f) << 0xe | uStack_28;
      if ((buffer[2] & 0x80) != 0) {
        local_2c = 4;
        uStack_28 = ((ulong)buffer[3] & 0x7f) << 0x15 | uStack_28;
        if ((buffer[3] & 0x80) != 0) {
          local_2c = 5;
          uStack_28 = ((ulong)buffer[4] & 0x7f) << 0x1c | uStack_28;
          if ((buffer[4] & 0x80) != 0) {
            local_2c = 6;
            uStack_28 = ((ulong)buffer[5] & 0x7f) << 0x23 | uStack_28;
            if ((buffer[5] & 0x80) != 0) {
              local_2c = 7;
              uStack_28 = ((ulong)buffer[6] & 0x7f) << 0x2a | uStack_28;
              if ((buffer[6] & 0x80) != 0) {
                local_2c = 8;
                uStack_28 = ((ulong)buffer[7] & 0x7f) << 0x31 | uStack_28;
                if ((buffer[7] & 0x80) != 0) {
                  local_2c = 9;
                  uStack_28 = (ulong)buffer[8] << 0x38 | uStack_28;
                }
              }
            }
          }
        }
      }
    }
  }
  *signed_value = uStack_28 >> 1 ^ -(uStack_28 & 1);
  return local_2c;
}

Assistant:

int zig_zag_decode_i64(const uint8_t* buffer, int64_t* signed_value)
{
    uint64_t v = buffer[0];
    uint64_t value = v & 0x7F;
    int bytesRead = 1;
    if ((v & 0x80) != 0)
    {
        bytesRead = 2;
        v = buffer[1];
        value |= (v & 0x7F) << 7;
        if ((v & 0x80) != 0)
        {
            bytesRead = 3;
            v = buffer[2];
            value |= (v & 0x7F) << 14;
            if ((v & 0x80) != 0)
            {
                bytesRead = 4;
                v = buffer[3];
                value |= (v & 0x7F) << 21;
                if ((v & 0x80) != 0)
                {
                    bytesRead = 5;
                    v = buffer[4];
                    value |= (v & 0x7F) << 28;
                    if ((v & 0x80) != 0)
                    {
                        bytesRead = 6;
                        v = buffer[5];
                        value |= (v & 0x7F) << 35;
                        if ((v & 0x80) != 0)
                        {
                            bytesRead = 7;
                            v = buffer[6];
                            value |= (v & 0x7F) << 42;
                            if ((v & 0x80) != 0)
                            {
                                bytesRead = 8;
                                v = buffer[7];
                                value |= (v & 0x7F) << 49;
                                if ((v & 0x80) != 0)
                                {
                                    bytesRead = 9;
                                    v = buffer[8];
                                    value |= v << 56;
                                }
                            }
                        }
                    }
                }
            }
        }
    }

#if defined(_MSC_VER)
#pragma warning(push)
#pragma warning(disable: 4146) /* C4146: unary minus operator applied to unsigned type, result still unsigned */
#endif
    value = (value >> 1) ^ (-(value & 1));
#if defined(_MSC_VER)
#pragma warning(pop)
#endif
    *signed_value = (int64_t) value;

    return bytesRead;
}